

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O1

void __thiscall
TEST_TestRegistry_reallyUndoLastTest_TestShell::~TEST_TestRegistry_reallyUndoLastTest_TestShell
          (TEST_TestRegistry_reallyUndoLastTest_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestRegistry, reallyUndoLastTest)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(myRegistry->countTests() == 2);
    myRegistry->unDoLastAddTest();
    CHECK(myRegistry->countTests() == 1);
    myRegistry->runAllTests(*result);
    CHECK(test1->hasRun_);
    CHECK(!test2->hasRun_);
}